

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  int iVar1;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar2;
  string *extraout_RAX;
  Extension *pEVar3;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *psVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  undefined1 *puVar6;
  uint extraout_EDX;
  int index;
  undefined7 in_register_00000011;
  ExtensionSet *pEVar7;
  AllocatedData *pAVar8;
  AllocatedData *pAVar9;
  AllocatedData *this_00;
  LogMessageFatal *pLVar10;
  ulong uVar11;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar12;
  LogMessageFatal aLStack_c8 [16];
  Extension *pEStack_b8;
  AllocatedData *pAStack_b0;
  AllocatedData aAStack_a8 [2];
  AllocatedData AStack_98;
  Extension *pEStack_90;
  ulong uStack_88;
  ExtensionSet *pEStack_78;
  AllocatedData aAStack_68 [2];
  ulong uStack_58;
  Extension *pEStack_50;
  
  puVar6 = (undefined1 *)CONCAT71(in_register_00000009,packed);
  uVar11 = CONCAT71(in_register_00000011,type) & 0xffffffff;
  pEStack_50 = (Extension *)0x25c357;
  pVar12 = Insert(this,number);
  pEVar3 = pVar12.first;
  pEVar3->descriptor = descriptor;
  if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar3->is_repeated == false) goto LAB_0025c422;
    psVar4 = (string *)0x0;
LAB_0025c3bb:
    if (psVar4 != (string *)0x0) {
      pEStack_50 = (Extension *)0x25c492;
      AddEnum();
      goto LAB_0025c492;
    }
    uVar5 = pEVar3->type - 0x13;
    puVar6 = (undefined1 *)(ulong)uVar5;
    if ((byte)uVar5 < 0xee) {
      pEVar7 = (ExtensionSet *)&stack0xffffffffffffffc0;
      pEStack_50 = (Extension *)0x25c441;
      AddEnum(pEVar7);
      goto LAB_0025c441;
    }
    puVar6 = WireFormatLite::kFieldTypeToCppTypeMap;
    if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar3->type * 4) == 8) {
      psVar4 = (string *)0x0;
    }
    else {
      pEStack_50 = (Extension *)0x25c468;
      psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                          (ulong)pEVar3->type * 4),8,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    }
    if (psVar4 != (string *)0x0) goto LAB_0025c49f;
    if (pEVar3->is_packed == packed) {
      psVar4 = (string *)0x0;
    }
    else {
      pEStack_50 = (Extension *)0x25c480;
      psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (pEVar3->is_packed,packed,"extension->is_packed == packed");
    }
    if (psVar4 == (string *)0x0) goto LAB_0025c400;
  }
  else {
    pEVar3->type = (FieldType)uVar11;
    if ((byte)(type - 0x13) < 0xee) {
      pEStack_50 = (Extension *)0x25c422;
      AddEnum((ExtensionSet *)&stack0xffffffffffffffc0);
LAB_0025c422:
      pEStack_50 = (Extension *)0x25c435;
      psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (1,0,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                         );
      goto LAB_0025c3bb;
    }
    puVar6 = WireFormatLite::kFieldTypeToCppTypeMap;
    pEVar7 = (ExtensionSet *)
             (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4);
    if (pEVar7 == (ExtensionSet *)0x8) {
      psVar4 = (string *)0x0;
    }
    else {
LAB_0025c441:
      pEStack_50 = (Extension *)0x25c452;
      psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pEVar7,8,"cpp_type(extension->type) == WireFormatLite::CPPTYPE_ENUM"
                         );
    }
    if (psVar4 == (string *)0x0) {
      pEVar3->is_repeated = true;
      pEVar3->field_0xa = pEVar3->field_0xa | 1;
      pEVar3->is_packed = packed;
      pEStack_50 = (Extension *)0x25c3ad;
      aVar2 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<int>>(this->arena_);
      pEVar3->field_0 = aVar2;
LAB_0025c400:
      RepeatedField<int>::Add((RepeatedField<int> *)pEVar3->field_0,value);
      return;
    }
LAB_0025c492:
    pEStack_50 = (Extension *)0x25c49f;
    AddEnum();
LAB_0025c49f:
    pEStack_50 = (Extension *)0x25c4ac;
    AddEnum();
    psVar4 = extraout_RAX;
  }
  iVar1 = (int)psVar4;
  pEVar7 = (ExtensionSet *)&stack0xffffffffffffffc0;
  pEStack_50 = (Extension *)0x25c4b9;
  AddEnum();
  pEStack_78 = (ExtensionSet *)0x25c4c9;
  uStack_58 = (ulong)(uint)value;
  pEStack_50 = pEVar3;
  pEVar3 = FindOrNull(pEVar7,iVar1);
  if (pEVar3 == (Extension *)0x0) {
    return;
  }
  if ((pEVar3->field_0xa & 2) != 0) {
    return;
  }
  if (pEVar3->is_repeated == false) {
    psVar4 = (string *)0x0;
  }
  else {
    pEStack_78 = (ExtensionSet *)0x25c528;
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (psVar4 == (string *)0x0) {
    uVar5 = pEVar3->type - 0x13;
    puVar6 = (undefined1 *)(ulong)uVar5;
    if ((byte)uVar5 < 0xee) {
      pAVar8 = aAStack_68;
      pEStack_78 = (ExtensionSet *)0x25c534;
      GetString();
LAB_0025c534:
      pEStack_78 = (ExtensionSet *)0x25c545;
      psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pAVar8,9,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_STRING");
    }
    else {
      puVar6 = WireFormatLite::kFieldTypeToCppTypeMap;
      pAVar8 = (AllocatedData *)
               (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar3->type * 4);
      if (pAVar8 != (AllocatedData *)0x9) goto LAB_0025c534;
      psVar4 = (string *)0x0;
    }
    if (psVar4 == (string *)0x0) {
      return;
    }
  }
  else {
    pEStack_78 = (ExtensionSet *)0x25c554;
    GetString();
    psVar4 = extraout_RAX_00;
  }
  iVar1 = (int)psVar4;
  pAVar8 = aAStack_68;
  pEStack_78 = (ExtensionSet *)0x25c561;
  GetString();
  pAVar9 = aAStack_a8;
  this_00 = aAStack_a8;
  pAStack_b0 = (AllocatedData *)0x25c57b;
  pEStack_90 = pEVar3;
  uStack_88 = uVar11;
  pEStack_78 = this;
  pVar12 = Insert((ExtensionSet *)pAVar8,iVar1);
  pEVar3 = pVar12.first;
  pEVar3->descriptor = (FieldDescriptor *)puVar6;
  if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar3->is_repeated != false) goto LAB_0025c62c;
    psVar4 = (string *)0x0;
LAB_0025c5e5:
    if (psVar4 != (string *)0x0) {
      pAStack_b0 = (AllocatedData *)0x25c67d;
      MutableString_abi_cxx11_();
      goto LAB_0025c67d;
    }
    if ((byte)(pEVar3->type - 0x13) < 0xee) {
      pAStack_b0 = (AllocatedData *)0x25c649;
      MutableString_abi_cxx11_((ExtensionSet *)aAStack_a8);
      goto LAB_0025c649;
    }
    if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar3->type * 4) == 9) {
      psVar4 = (string *)0x0;
    }
    else {
      pAStack_b0 = (AllocatedData *)0x25c670;
      psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                          (ulong)pEVar3->type * 4),9,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_STRING");
    }
    if (psVar4 == (string *)0x0) goto LAB_0025c611;
  }
  else {
    pEVar3->type = (FieldType)extraout_EDX;
    if ((byte)((FieldType)extraout_EDX - 0x13) < 0xee) {
      pAStack_b0 = (AllocatedData *)0x25c62c;
      MutableString_abi_cxx11_((ExtensionSet *)aAStack_a8);
LAB_0025c62c:
      pAStack_b0 = (AllocatedData *)0x25c63f;
      psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (0,1,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
      goto LAB_0025c5e5;
    }
    pAVar9 = (AllocatedData *)
             (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                             (ulong)(extraout_EDX & 0xff) * 4);
    if (pAVar9 == (AllocatedData *)0x9) {
      psVar4 = (string *)0x0;
    }
    else {
LAB_0025c649:
      pAStack_b0 = (AllocatedData *)0x25c65a;
      psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pAVar9,9,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_STRING");
    }
    if (psVar4 == (string *)0x0) {
      pEVar3->is_repeated = false;
      pEVar3->field_0xa = pEVar3->field_0xa | 1;
      aAStack_a8[0] = *pAVar8;
      pAStack_b0 = (AllocatedData *)0x25c5d8;
      AStack_98 = aAStack_a8[0];
      aVar2 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              absl::lts_20240722::utility_internal::
              IfConstexprElse<false,google::protobuf::Arena::Create<std::__cxx11::string>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_1_,google::protobuf::Arena::Create<std::__cxx11::string>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_2_>
                        ((anon_class_8_1_a7a63227 *)aAStack_a8,(anon_class_8_1_a7a63227 *)&AStack_98
                        );
      pEVar3->field_0 = aVar2;
LAB_0025c611:
      pEVar3->field_0xa = pEVar3->field_0xa & 0xfd;
      return;
    }
LAB_0025c67d:
    pAStack_b0 = (AllocatedData *)0x25c688;
    MutableString_abi_cxx11_();
    psVar4 = extraout_RAX_01;
  }
  iVar1 = (int)psVar4;
  pAStack_b0 = (AllocatedData *)0x25c693;
  MutableString_abi_cxx11_();
  pEStack_b8 = pEVar3;
  pAStack_b0 = pAVar8;
  pEVar3 = FindOrNull((ExtensionSet *)this_00,iVar1);
  if (pEVar3 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,600,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_c8,0x25,"Index out-of-bounds (field is empty).");
    goto LAB_0025c781;
  }
  if (pEVar3->is_repeated == false) {
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (1,0,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                       );
  }
  else {
    psVar4 = (string *)0x0;
  }
  if (psVar4 == (string *)0x0) {
    if ((byte)(pEVar3->type - 0x13) < 0xee) {
      pLVar10 = aLStack_c8;
      GetRepeatedString_abi_cxx11_();
LAB_0025c751:
      psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pLVar10,9,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_STRING");
    }
    else {
      pLVar10 = (LogMessageFatal *)
                (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar3->type * 4);
      if (pLVar10 != (LogMessageFatal *)0x9) goto LAB_0025c751;
      psVar4 = (string *)0x0;
    }
    if (psVar4 == (string *)0x0) {
      RepeatedPtrFieldBase::
      Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                ((RepeatedPtrFieldBase *)pEVar3->field_0,index);
      return;
    }
  }
  else {
    GetRepeatedString_abi_cxx11_();
  }
  GetRepeatedString_abi_cxx11_();
LAB_0025c781:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_c8);
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->is_packed = packed;
    extension->ptr.repeated_enum_value =
        Arena::Create<RepeatedField<int>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    ABSL_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->ptr.repeated_enum_value->Add(value);
}